

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

void __thiscall
cmQtAutoGenInitializer::ConfigFileClean(cmQtAutoGenInitializer *this,ConfigString *configString)

{
  _Hash_node_base *p_Var1;
  
  AddCleanFile(this,&configString->Default);
  p_Var1 = (configString->Config)._M_h._M_before_begin._M_nxt;
  if ((p_Var1 != (_Hash_node_base *)0x0 & this->MultiConfig) == 1) {
    do {
      AddCleanFile(this,(string *)(p_Var1 + 5));
      p_Var1 = p_Var1->_M_nxt;
    } while (p_Var1 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void cmQtAutoGenInitializer::ConfigFileClean(ConfigString& configString)
{
  this->AddCleanFile(configString.Default);
  if (this->MultiConfig) {
    for (auto const& pair : configString.Config) {
      this->AddCleanFile(pair.second);
    }
  }
}